

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O2

void yy_1_statement(GREG *G,char *yytext,int yyleng,yythunk *thunk,PVIPParserContext yyxvar)

{
  PVIPNode *pPVar1;
  
  pPVar1 = PVIP_node_new_children(&G->data,PVIP_NODE_STUB);
  G->ss = pPVar1;
  return;
}

Assistant:

YY_ACTION(void) yy_1_statement(GREG *G, char *yytext, int yyleng, yythunk *thunk, YY_XTYPE YY_XVAR)
{
#define e G->val[-1]
#define b G->val[-2]
#define bl G->val[-3]
  yyprintf((stderr, "do yy_1_statement"));
  yyprintfvTcontext(yytext);
  yyprintf((stderr, "\n  {yy = PVIP_node_new_children(&(G->data), PVIP_NODE_STUB); }\n"));
  yy = PVIP_node_new_children(&(G->data), PVIP_NODE_STUB); ;
#undef e
#undef b
#undef bl
}